

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawWall4PalCommand::Execute(DrawWall4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  uint8_t *puVar11;
  uint8_t *puVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  uint8_t *puVar23;
  uint uVar24;
  uint uVar25;
  
  iVar20 = (this->super_PalWall4Command).super_DrawerCommand._dest_y;
  iVar1 = (this->super_PalWall4Command)._count;
  iVar19 = thread->pass_end_y - iVar20;
  if (iVar19 < 1) {
    iVar19 = 0;
  }
  if (iVar1 < iVar19) {
    iVar19 = iVar1;
  }
  uVar21 = thread->pass_start_y - iVar20;
  if ((int)uVar21 < 1) {
    uVar21 = 0;
  }
  iVar1 = thread->num_cores;
  iVar20 = (iVar1 - (int)((iVar20 + uVar21) - thread->core) % iVar1) % iVar1;
  uVar15 = (long)(int)((~uVar21 + iVar1 + iVar19) - iVar20) / (long)iVar1;
  uVar17 = uVar15 & 0xffffffff;
  if (0 < (int)uVar15) {
    iVar19 = (this->super_PalWall4Command)._fracbits;
    puVar7 = (this->super_PalWall4Command)._colormap[0];
    puVar8 = (this->super_PalWall4Command)._colormap[1];
    puVar9 = (this->super_PalWall4Command)._colormap[2];
    iVar2 = (this->super_PalWall4Command)._pitch;
    uVar3 = (this->super_PalWall4Command)._iscale[3];
    uVar4 = (this->super_PalWall4Command)._iscale[2];
    uVar5 = (this->super_PalWall4Command)._iscale[1];
    uVar6 = (this->super_PalWall4Command)._iscale[0];
    iVar20 = iVar20 + uVar21;
    uVar24 = uVar6 * iVar20 + (this->super_PalWall4Command)._texturefrac[0];
    uVar25 = uVar5 * iVar20 + (this->super_PalWall4Command)._texturefrac[1];
    uVar22 = uVar4 * iVar20 + (this->super_PalWall4Command)._texturefrac[2];
    puVar23 = (this->super_PalWall4Command)._dest + (long)(iVar2 * iVar20) + 3;
    puVar10 = (this->super_PalWall4Command)._colormap[3];
    uVar21 = iVar20 * uVar3 + (this->super_PalWall4Command)._texturefrac[3];
    puVar11 = (this->super_PalWall4Command)._source[0];
    puVar12 = (this->super_PalWall4Command)._source[1];
    puVar13 = (this->super_PalWall4Command)._source[2];
    puVar14 = (this->super_PalWall4Command)._source[3];
    do {
      bVar18 = (byte)iVar19;
      puVar23[-3] = puVar7[puVar11[uVar24 >> (bVar18 & 0x3f)]];
      puVar23[-2] = puVar8[puVar12[uVar25 >> (bVar18 & 0x3f)]];
      puVar23[-1] = puVar9[puVar13[uVar22 >> (bVar18 & 0x3f)]];
      *puVar23 = puVar10[puVar14[uVar21 >> (bVar18 & 0x3f)]];
      uVar24 = uVar24 + uVar6 * iVar1;
      uVar25 = uVar25 + uVar5 * iVar1;
      uVar22 = uVar22 + uVar4 * iVar1;
      uVar21 = uVar21 + uVar3 * iVar1;
      puVar23 = puVar23 + iVar2 * iVar1;
      uVar16 = (int)uVar17 - 1;
      uVar17 = (ulong)uVar16;
    } while (uVar16 != 0);
  }
  return;
}

Assistant:

void DrawWall4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;
		uint32_t place;
		auto pal0 = _colormap[0];
		auto pal1 = _colormap[1];
		auto pal2 = _colormap[2];
		auto pal3 = _colormap[3];
		auto buf0 = _source[0];
		auto buf1 = _source[1];
		auto buf2 = _source[2];
		auto buf3 = _source[3];
		auto dc_wall_iscale0 = _iscale[0];
		auto dc_wall_iscale1 = _iscale[1];
		auto dc_wall_iscale2 = _iscale[2];
		auto dc_wall_iscale3 = _iscale[3];
		auto dc_wall_texturefrac0 = _texturefrac[0];
		auto dc_wall_texturefrac1 = _texturefrac[1];
		auto dc_wall_texturefrac2 = _texturefrac[2];
		auto dc_wall_texturefrac3 = _texturefrac[3];
		auto pitch = _pitch;

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		dc_wall_texturefrac0 += dc_wall_iscale0 * skipped;
		dc_wall_texturefrac1 += dc_wall_iscale1 * skipped;
		dc_wall_texturefrac2 += dc_wall_iscale2 * skipped;
		dc_wall_texturefrac3 += dc_wall_iscale3 * skipped;
		dc_wall_iscale0 *= thread->num_cores;
		dc_wall_iscale1 *= thread->num_cores;
		dc_wall_iscale2 *= thread->num_cores;
		dc_wall_iscale3 *= thread->num_cores;
		pitch *= thread->num_cores;

		do
		{
			dest[0] = pal0[buf0[(place = dc_wall_texturefrac0) >> bits]]; dc_wall_texturefrac0 = place + dc_wall_iscale0;
			dest[1] = pal1[buf1[(place = dc_wall_texturefrac1) >> bits]]; dc_wall_texturefrac1 = place + dc_wall_iscale1;
			dest[2] = pal2[buf2[(place = dc_wall_texturefrac2) >> bits]]; dc_wall_texturefrac2 = place + dc_wall_iscale2;
			dest[3] = pal3[buf3[(place = dc_wall_texturefrac3) >> bits]]; dc_wall_texturefrac3 = place + dc_wall_iscale3;
			dest += pitch;
		} while (--count);
	}